

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O3

void tag_eval(mdl_t *mdl,double *te,double *se)

{
  uint W;
  uint32_t uVar1;
  uint32_t uVar2;
  void *__ptr;
  long lVar3;
  double *pdVar4;
  undefined8 *puVar5;
  dat_t *pdVar6;
  void **ud;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  void *apvStack_70 [2];
  ulong uStack_60;
  ulong local_58;
  ulong uStack_50;
  double *local_40;
  double *local_38;
  
  pdVar6 = mdl->devel;
  W = mdl->opt->nthread;
  uVar8 = (ulong)W;
  if (pdVar6 == (dat_t *)0x0) {
    pdVar6 = mdl->train;
  }
  lVar3 = -(uVar8 * 8 + 0xf & 0xfffffffffffffff0);
  ud = (void **)((long)apvStack_70 + lVar3 + 8);
  local_38 = se;
  local_40 = te;
  if (uVar8 == 0) {
    uVar1 = pdVar6->nseq;
    uVar2 = mdl->opt->jobsize;
    *(undefined8 *)((long)apvStack_70 + lVar3) = 0x107f17;
    mth_spawn(tag_evalsub,W,ud,uVar1,uVar2);
  }
  else {
    uVar7 = 0;
    do {
      *(undefined8 *)((long)apvStack_70 + lVar3) = 0x107e0a;
      puVar5 = (undefined8 *)xmalloc(0x30);
      ud[uVar7] = puVar5;
      *puVar5 = mdl;
      puVar5[1] = pdVar6;
      uVar7 = uVar7 + 1;
    } while (uVar8 != uVar7);
    uVar1 = pdVar6->nseq;
    uVar2 = mdl->opt->jobsize;
    *(undefined8 *)((long)apvStack_70 + lVar3) = 0x107e3a;
    mth_spawn(tag_evalsub,W,ud,uVar1,uVar2);
    pdVar4 = local_38;
    if (uVar8 != 0) {
      apvStack_70[1] = (void *)0x0;
      uStack_60 = 0;
      uVar7 = 0;
      local_58 = 0;
      uStack_50 = 0;
      do {
        __ptr = ud[uVar7];
        local_58 = local_58 + *(long *)((long)__ptr + 0x10);
        uStack_50 = uStack_50 + *(long *)((long)__ptr + 0x20);
        apvStack_70[1] = (void *)((long)apvStack_70[1] + *(long *)((long)__ptr + 0x18));
        uStack_60 = uStack_60 + *(long *)((long)__ptr + 0x28);
        *(undefined8 *)((long)apvStack_70 + lVar3) = 0x107e88;
        free(__ptr);
        uVar7 = uVar7 + 1;
      } while (uVar8 != uVar7);
      auVar10._0_8_ =
           ((double)((ulong)apvStack_70[1] >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
           (double)((ulong)apvStack_70[1] & 0xffffffff | 0x4330000000000000);
      auVar10._8_8_ =
           ((double)(uStack_60 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
           (double)(uStack_60 & 0xffffffff | 0x4330000000000000);
      auVar12._0_8_ =
           ((double)(local_58 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
           (double)(local_58 & 0xffffffff | 0x4330000000000000);
      auVar12._8_8_ =
           ((double)(uStack_50 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
           (double)(uStack_50 & 0xffffffff | 0x4330000000000000);
      auVar10 = divpd(auVar10,auVar12);
      dVar9 = auVar10._0_8_ * 100.0;
      dVar11 = auVar10._8_8_ * 100.0;
      local_38 = pdVar4;
      goto LAB_00107f1f;
    }
  }
  dVar9 = NAN;
  dVar11 = NAN;
LAB_00107f1f:
  *local_40 = dVar9;
  *local_38 = dVar11;
  return;
}

Assistant:

void tag_eval(mdl_t *mdl, double *te, double *se) {
	const uint32_t W = mdl->opt->nthread;
	dat_t *dat = (mdl->devel == NULL) ? mdl->train : mdl->devel;
	// First we prepare the eval state for all the workers threads, we just
	// have to give them the model and dataset to use. This state will be
	// used to retrieve partial result they computed.
	eval_t *eval[W];
	for (uint32_t w = 0; w < W; w++) {
		eval[w] = xmalloc(sizeof(eval_t));
		eval[w]->mdl = mdl;
		eval[w]->dat = dat;
	}
	// And next, we call the workers to do the job and reduce the partial
	// result by summing them and computing the final error rates.
	mth_spawn((func_t *)tag_evalsub, W, (void *)eval, dat->nseq,
		mdl->opt->jobsize);
	uint64_t tcnt = 0, terr = 0;
	uint64_t scnt = 0, serr = 0;
	for (uint32_t w = 0; w < W; w++) {
		tcnt += eval[w]->tcnt;
		terr += eval[w]->terr;
		scnt += eval[w]->scnt;
		serr += eval[w]->serr;
		free(eval[w]);
	}
	*te = (double)terr / tcnt * 100.0;
	*se = (double)serr / scnt * 100.0;
}